

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::api::anon_unknown_1::Image::create
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  VkImageCreateInfo local_58;
  
  local_58.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_58.pNext = (void *)0x0;
  local_58._16_8_ = *(undefined8 *)param_2;
  local_58.format = *(VkFormat *)(param_2 + 8);
  local_58.extent._0_8_ = *(undefined8 *)(param_2 + 0xc);
  local_58.extent.depth = *(deUint32 *)(param_2 + 0x14);
  local_58._40_8_ = *(undefined8 *)(param_2 + 0x18);
  local_58._48_8_ = *(undefined8 *)(param_2 + 0x20);
  local_58.usage = *(VkImageUsageFlags *)(param_2 + 0x28);
  local_58.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_58.queueFamilyIndexCount = 1;
  local_58.pQueueFamilyIndices = &env->queueFamilyIndex;
  local_58.initialLayout = *(VkImageLayout *)(param_2 + 0x2c);
  pMVar1 = ::vk::createImage(__return_storage_ptr__,env->vkd,env->device,&local_58,
                             env->allocationCallbacks);
  return pMVar1;
}

Assistant:

static Move<VkImage> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkImageCreateInfo		imageInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,
			params.flags,
			params.imageType,
			params.format,
			params.extent,
			params.mipLevels,
			params.arraySize,
			params.samples,
			params.tiling,
			params.usage,
			VK_SHARING_MODE_EXCLUSIVE,		// sharingMode
			1u,								// queueFamilyIndexCount
			&env.queueFamilyIndex,			// pQueueFamilyIndices
			params.initialLayout
		};

		return createImage(env.vkd, env.device, &imageInfo, env.allocationCallbacks);
	}